

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O3

pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
* __thiscall
Jinx::Impl::Script::WalkSubscripts
          (pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
           *__return_storage_ptr__,Script *this,uint32_t subscripts,CollectionPtr *collection)

{
  pointer pVVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
  *this_00;
  element_type *peVar3;
  undefined8 uVar4;
  bool bVar5;
  iterator iVar6;
  ulong uVar7;
  ulong uVar8;
  Variant newColl;
  Variant key;
  element_type *local_f8;
  anon_union_32_12_f16a26ea_for_Variant_1 aStack_f0;
  Variant local_d0;
  Variant local_a8;
  Variant local_80;
  Variant local_58;
  
  local_80.m_type = Null;
  if (subscripts != 0) {
    uVar8 = (ulong)subscripts;
    uVar7 = 0;
    do {
      pVVar1 = (this->m_stack).
               super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Variant::operator=(&local_80,
                         pVVar1 + (((ulong)((long)(this->m_stack).
                                                  super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pVVar1) >> 3) * -0x3333333333333333 -
                                  (uVar8 & 0xffffffff)));
      bVar5 = Variant::IsKeyType(&local_80);
      if (!bVar5) {
        Error(this,"Invalid key type");
LAB_0010e3d9:
        (__return_storage_ptr__->first).
        super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        (__return_storage_ptr__->first).
        super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (__return_storage_ptr__->second).m_type = Null;
        goto LAB_0010e3eb;
      }
      if (uVar7 < subscripts - 1) {
        iVar6 = std::
                _Rb_tree<Jinx::Variant,_std::pair<const_Jinx::Variant,_Jinx::Variant>,_std::_Select1st<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
                ::find(&((collection->
                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->_M_t,&local_80);
        if ((_Rb_tree_header *)iVar6._M_node ==
            &(((collection->
               super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->_M_t)._M_impl.super__Rb_tree_header) {
          CreateCollection();
          local_a8.m_type = Null;
          Variant::SetCollection(&local_a8,(CollectionPtr *)&local_f8);
          if (aStack_f0._0_8_ != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       aStack_f0.m_collection.
                       super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
          }
          this_00 = (_Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
                     *)(collection->
                       super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
          std::pair<Jinx::Variant,_Jinx::Variant>::pair<Jinx::Variant_&,_Jinx::Variant_&,_true>
                    ((pair<Jinx::Variant,_Jinx::Variant> *)&local_f8,&local_80,&local_a8);
          std::
          _Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
          ::_M_emplace_unique<std::pair<Jinx::Variant,Jinx::Variant>>
                    (this_00,(pair<Jinx::Variant,_Jinx::Variant> *)&local_f8);
          Variant::~Variant(&local_d0);
          Variant::~Variant((Variant *)&local_f8);
          Variant::GetCollection((Variant *)&local_f8);
          uVar4 = aStack_f0.m_number;
          peVar3 = local_f8;
          local_f8 = (element_type *)0x0;
          aStack_f0.m_number = 0.0;
          p_Var2 = (collection->
                   super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_refcount._M_pi;
          (collection->
          super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
          )._M_ptr = peVar3;
          (collection->
          super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
          )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            if (aStack_f0._0_8_ != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         aStack_f0.m_collection.
                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
            }
          }
          Variant::~Variant(&local_a8);
        }
        else {
          if (*(int *)&iVar6._M_node[2]._M_parent != 5) {
            Error(this,"Expected collection when accessing by key");
            goto LAB_0010e3d9;
          }
          Variant::GetCollection((Variant *)&local_f8);
          uVar4 = aStack_f0.m_collection.
                  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
          peVar3 = local_f8;
          local_f8 = (element_type *)0x0;
          aStack_f0.m_number = 0.0;
          p_Var2 = (collection->
                   super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_refcount._M_pi;
          (collection->
          super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
          )._M_ptr = peVar3;
          (collection->
          super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
          )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            if (aStack_f0._0_8_ != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         aStack_f0.m_collection.
                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
            }
          }
        }
      }
      uVar7 = uVar7 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    if (subscripts != 0) {
      do {
        Pop(&local_58,this);
        Variant::~Variant(&local_58);
        subscripts = subscripts - 1;
      } while (subscripts != 0);
    }
  }
  std::
  pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
  ::
  pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_&,_Jinx::Variant_&,_true>
            (__return_storage_ptr__,collection,&local_80);
LAB_0010e3eb:
  Variant::~Variant(&local_80);
  return __return_storage_ptr__;
}

Assistant:

inline_t std::pair<CollectionPtr, Variant> Script::WalkSubscripts(uint32_t subscripts, CollectionPtr collection)
	{
		// Walk up through subsequent subscript operators, then pops the keys off the stack and 
		// returns the final collection and key pair,
		Variant key;

		// Loop through the number of subscript operations used
		for (uint32_t i = 0; i < subscripts; ++i)
		{
			// Grab the appropriate key in the stack for this subscript 
			size_t index = m_stack.size() - (subscripts - i);
			key = m_stack[index];
			if (!key.IsKeyType())
			{
				Error("Invalid key type");
				return {};
			}

			// We only need to retrieve a new collection and key set if
			// this isn't the last operation.
			if (i < (subscripts - 1))
			{
				auto itr = collection->find(key);
				if (itr == collection->end())
				{
					Variant newColl = CreateCollection();
					collection->insert(std::make_pair(key, newColl));
					collection = newColl.GetCollection();
				}
				else if (itr->second.IsCollection())
				{
					collection = itr->second.GetCollection();
				}
				else
				{
					Error("Expected collection when accessing by key");
					return {};
				}
			}
		}

		// Pop keys off the stack
		for (uint32_t i = 0; i < subscripts; ++i)
			Pop();

		// Return the final collection and key pair
		return std::make_pair(collection, key);
	}